

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int set_int_attr(attr_list list,atom_t attr_id,int ivalue)

{
  undefined8 in_R8;
  attr_union value;
  
  value.u.l._4_4_ = 0;
  value.u.i = ivalue;
  value.u.o.buffer = (void *)in_R8;
  set_pattr(list,attr_id,Attr_Int4,value);
  return 1;
}

Assistant:

extern int
set_int_attr(attr_list list, atom_t attr_id, int ivalue)
{
    attr_value_type t = Attr_Int4;
    attr_union tmp;
    tmp.u.l = 0;
    tmp.u.i = ivalue;
    if (sizeof(int) == 8) t = Attr_Int8;
    return set_pattr(list, attr_id, t, tmp);
}